

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O2

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator::next
          (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
           *__return_storage_ptr__,FastInstancesIterator *this)

{
  TypedTermList term;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  InstMatcher *this_00;
  Renaming normalizer;
  uint in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff94;
  undefined1 local_48 [32];
  
  do {
    iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 != '\0') break;
    bVar1 = findNextLeaf(this);
  } while (bVar1);
  iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[3])();
  if (this->_retrieveSubstitution == true) {
    Kernel::Renaming::reset(&this->_resultDenormalizer);
    term._4_8_ = in_stack_ffffffffffffff8c;
    term.super_TermList._content._0_4_ = in_stack_ffffffffffffff88;
    term._sort._content._4_4_ = in_stack_ffffffffffffff94;
    bVar1 = isGround(term);
    if (!bVar1) {
      Kernel::Renaming::normalizeVariables
                ((Renaming *)&stack0xffffffffffffff88,((Rhs *)CONCAT44(extraout_var,iVar2))->term);
      Kernel::Renaming::makeInverse(&this->_resultDenormalizer,(Renaming *)&stack0xffffffffffffff88)
      ;
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                ((DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash> *)
                 &stack0xffffffffffffff88);
    }
    this_00 = (InstMatcher *)(local_48 + 0x10);
    SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::getSubstitution
              (this_00,(Renaming *)&this->_subst);
  }
  else {
    this_00 = (InstMatcher *)local_48;
    local_48._0_8_ = 0;
    local_48._8_8_ = (TermList *)0x0;
  }
  Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr
            (&__return_storage_ptr__->unifier,(SmartPtr<Indexing::ResultSubstitution> *)this_00);
  __return_storage_ptr__->data = (Rhs *)CONCAT44(extraout_var,iVar2);
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
            ((SmartPtr<Indexing::ResultSubstitution> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastInstancesIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultDenormalizer.reset();
    bool ground = SubstitutionTree::isGround(ld->key());
    if(!ground) {
      Renaming normalizer;
      normalizer.normalizeVariables(ld->key());
      _resultDenormalizer.makeInverse(normalizer);
    }

    return QueryRes(_subst.getSubstitution(&_resultDenormalizer), ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}